

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

void test<long>(bool shouldBeValid,string *value)

{
  long lVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  size_type sVar4;
  uint uVar5;
  bool bVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  size_type sVar10;
  undefined7 in_register_00000039;
  byte bVar11;
  char *pcVar12;
  uint uVar13;
  ulong uVar14;
  bool valid;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  bool local_6a;
  bool local_69;
  AssertHelper local_68;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  sVar4 = value->_M_string_length;
  if (sVar4 == 0) {
LAB_00120b2d:
    local_6a = false;
    uVar9 = 0;
  }
  else {
    pcVar7 = (value->_M_dataplus)._M_p;
    pcVar12 = pcVar7 + sVar4;
    if (*pcVar7 == '-') {
      if (sVar4 == 1) goto LAB_00120b2d;
      pcVar7 = pcVar7 + 1;
      uVar14 = 0;
      uVar8 = CONCAT71(in_register_00000039,shouldBeValid);
      do {
        uVar9 = uVar14;
        if ((byte)(*pcVar7 - 0x3aU) < 0xf6) {
LAB_0012062e:
          local_6a = false;
          bVar6 = false;
          uVar14 = uVar9;
        }
        else {
          bVar11 = *pcVar7 - 0x30;
          if (((long)uVar9 < -0xccccccccccccccc) || (8 < bVar11 && uVar9 == 0xf333333333333334))
          goto LAB_0012062e;
          lVar1 = uVar9 * 10;
          bVar6 = true;
          uVar9 = uVar8;
          uVar14 = lVar1 - (ulong)bVar11;
        }
        if (!bVar6) goto LAB_001206c2;
        pcVar7 = pcVar7 + 1;
        uVar8 = uVar9;
      } while (pcVar7 < pcVar12);
    }
    else {
      if (*pcVar7 == '+') {
        pcVar7 = pcVar7 + 1;
      }
      if (pcVar7 == pcVar12) goto LAB_00120b2d;
      uVar14 = 0;
      uVar8 = CONCAT71(in_register_00000039,shouldBeValid);
      do {
        uVar9 = uVar14;
        if ((byte)(*pcVar7 - 0x3aU) < 0xf6) {
LAB_001206ab:
          local_6a = false;
          bVar6 = false;
          uVar14 = uVar9;
        }
        else {
          bVar11 = *pcVar7 - 0x30;
          if ((0xccccccccccccccc < (long)uVar9) || (7 < bVar11 && uVar9 == 0xccccccccccccccc))
          goto LAB_001206ab;
          lVar1 = uVar9 * 10;
          bVar6 = true;
          uVar9 = uVar8;
          uVar14 = (ulong)bVar11 + lVar1;
        }
        if (!bVar6) goto LAB_001206c2;
        pcVar7 = pcVar7 + 1;
        uVar8 = uVar9;
      } while (pcVar7 < pcVar12);
    }
    local_6a = true;
    uVar9 = uVar14;
  }
LAB_001206c2:
  local_69 = shouldBeValid;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_50,"shouldBeValid","valid",&local_69,&local_6a);
  if ((char)local_50._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_60);
    if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = *(char **)local_50._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp",
               0xc,pcVar12);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_60.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) &&
         (local_60.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_60.ptr_ + 8))();
      }
      local_60.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_50._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_50._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_69 != true) {
    return;
  }
  uVar14 = -uVar9;
  if (0 < (long)uVar9) {
    uVar14 = uVar9;
  }
  uVar13 = 1;
  if (9 < uVar14) {
    uVar8 = uVar14;
    uVar5 = 4;
    do {
      uVar13 = uVar5;
      if (uVar8 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_00120823;
      }
      if (uVar8 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_00120823;
      }
      if (uVar8 < 10000) goto LAB_00120823;
      bVar6 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      uVar5 = uVar13 + 4;
    } while (bVar6);
    uVar13 = uVar13 + 1;
  }
LAB_00120823:
  paVar2 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)uVar13 - (char)((long)uVar9 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_50._M_dataplus._M_p + -((long)uVar9 >> 0x3f),uVar13,uVar14);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_60,"value","std::to_string(result)",value,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_60.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp",
               0xe,pcVar12);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_50._M_dataplus._M_p + 8))();
      }
      local_50._M_dataplus._M_p = (pointer)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  sVar4 = value->_M_string_length;
  if (sVar4 != 0) {
    pcVar12 = (value->_M_dataplus)._M_p;
    if (*pcVar12 == '-') {
      if (sVar4 != 1) {
        sVar10 = 1;
        uVar14 = 0;
        do {
          uVar14 = (uVar14 * 10 - (long)pcVar12[sVar10]) + 0x30;
          sVar10 = sVar10 + 1;
        } while (sVar4 != sVar10);
        goto LAB_0012092c;
      }
    }
    else {
      pcVar7 = pcVar12 + sVar4;
      if (*pcVar12 == '+') {
        pcVar12 = pcVar12 + 1;
      }
      if (pcVar12 != pcVar7) {
        uVar14 = 0;
        do {
          cVar3 = *pcVar12;
          pcVar12 = pcVar12 + 1;
          uVar14 = ((long)cVar3 + uVar14 * 10) - 0x30;
        } while (pcVar12 != pcVar7);
        goto LAB_0012092c;
      }
    }
  }
  uVar14 = 0;
LAB_0012092c:
  uVar8 = -uVar14;
  if (0 < (long)uVar14) {
    uVar8 = uVar14;
  }
  uVar13 = 1;
  if (9 < uVar8) {
    uVar9 = uVar8;
    uVar5 = 4;
    do {
      uVar13 = uVar5;
      if (uVar9 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_00120a24;
      }
      if (uVar9 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_00120a24;
      }
      if (uVar9 < 10000) goto LAB_00120a24;
      bVar6 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      uVar5 = uVar13 + 4;
    } while (bVar6);
    uVar13 = uVar13 + 1;
  }
LAB_00120a24:
  local_50._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)uVar13 - (char)((long)uVar14 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_50._M_dataplus._M_p + -((long)uVar14 >> 0x3f),uVar13,uVar8);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_60,"value","std::to_string(result2)",value,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_60.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_58.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = ((local_58.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp",
               0x10,pcVar12);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_50._M_dataplus._M_p + 8))();
      }
      local_50._M_dataplus._M_p = (pointer)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  return;
}

Assistant:

static void test(bool shouldBeValid, std::string const& value) {
  bool valid;
  T result = jsteemann::atoi<T>(value.c_str(), value.c_str() + value.size(), valid);
  ASSERT_EQ(shouldBeValid, valid);
  if (shouldBeValid) {
    ASSERT_EQ(value, std::to_string(result));
    T result2 = jsteemann::atoi_unchecked<T>(value.c_str(), value.c_str() + value.size());
    ASSERT_EQ(value, std::to_string(result2));
  }
}